

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateF32VecHelper
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst,uint32_t num_components,
          function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *diag,uint32_t underlying_type)

{
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  string local_3e0;
  ostringstream local_3c0 [8];
  ostringstream ss_1;
  undefined1 local_240 [4];
  uint32_t bit_width;
  string local_220;
  ostringstream local_200 [8];
  ostringstream ss;
  undefined1 local_80 [4];
  uint32_t actual_num_components;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  uint32_t local_3c;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *pfStack_38;
  uint32_t underlying_type_local;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *diag_local;
  Instruction *pIStack_28;
  uint32_t num_components_local;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  local_3c = underlying_type;
  pfStack_38 = diag;
  diag_local._4_4_ = num_components;
  pIStack_28 = inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  bVar2 = ValidationState_t::IsFloatVectorType(this->_,underlying_type);
  pfVar1 = pfStack_38;
  if (bVar2) {
    uVar3 = ValidationState_t::GetDimension(this->_,local_3c);
    uVar4 = ValidationState_t::GetDimension(this->_,local_3c);
    if (uVar4 == diag_local._4_4_) {
      uVar3 = ValidationState_t::GetBitWidth(this->_,local_3c);
      if (uVar3 == 0x20) {
        this_local._4_4_ = SPV_SUCCESS;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_3c0);
        (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                  (&local_3e0,this,(Decoration *)inst_local,pIStack_28);
        poVar5 = std::operator<<((ostream *)local_3c0,(string *)&local_3e0);
        poVar5 = std::operator<<(poVar5," has components with bit width ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
        std::operator<<(poVar5,".");
        std::__cxx11::string::~string((string *)&local_3e0);
        pfVar1 = pfStack_38;
        std::__cxx11::ostringstream::str();
        this_local._4_4_ =
             std::
             function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             ::operator()(pfVar1,&local_400);
        std::__cxx11::string::~string((string *)&local_400);
        std::__cxx11::ostringstream::~ostringstream(local_3c0);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_200);
      (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
                (&local_220,this,(Decoration *)inst_local,pIStack_28);
      poVar5 = std::operator<<((ostream *)local_200,(string *)&local_220);
      poVar5 = std::operator<<(poVar5," has ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
      std::operator<<(poVar5," components.");
      std::__cxx11::string::~string((string *)&local_220);
      pfVar1 = pfStack_38;
      std::__cxx11::ostringstream::str();
      this_local._4_4_ =
           std::
           function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           ::operator()(pfVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_240);
      std::__cxx11::string::~string((string *)local_240);
      std::__cxx11::ostringstream::~ostringstream(local_200);
    }
  }
  else {
    (anonymous_namespace)::BuiltInsValidator::GetDefinitionDesc_abi_cxx11_
              ((string *)local_80,this,(Decoration *)inst_local,pIStack_28);
    std::operator+(&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   " is not a float vector.");
    this_local._4_4_ =
         std::
         function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         ::operator()(pfVar1,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)local_80);
  }
  return this_local._4_4_;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateF32VecHelper(
    const Decoration& decoration, const Instruction& inst,
    uint32_t num_components,
    const std::function<spv_result_t(const std::string& message)>& diag,
    uint32_t underlying_type) {
  if (!_.IsFloatVectorType(underlying_type)) {
    return diag(GetDefinitionDesc(decoration, inst) +
                " is not a float vector.");
  }

  const uint32_t actual_num_components = _.GetDimension(underlying_type);
  if (_.GetDimension(underlying_type) != num_components) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst) << " has "
       << actual_num_components << " components.";
    return diag(ss.str());
  }

  const uint32_t bit_width = _.GetBitWidth(underlying_type);
  if (bit_width != 32) {
    std::ostringstream ss;
    ss << GetDefinitionDesc(decoration, inst)
       << " has components with bit width " << bit_width << ".";
    return diag(ss.str());
  }

  return SPV_SUCCESS;
}